

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

bool __thiscall wallet::MockableBatch::ErasePrefix(MockableBatch *this,Span<const_std::byte> prefix)

{
  long lVar1;
  iterator __position;
  bool bVar2;
  __normal_iterator<const_std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
  __last1;
  _Rb_tree_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
  *this_00;
  _Rb_tree_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
  *p_Var3;
  byte *in_RDI;
  long in_FS_OFFSET;
  vector<std::byte,_zero_after_free_allocator<std::byte>_> *key;
  iterator it;
  Span<const_std::byte> *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  __normal_iterator<const_std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
  *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff78;
  byte bVar4;
  __normal_iterator<const_std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
  __first1;
  bool local_49;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RDI[0x10] & 1) == 0) {
    local_49 = false;
  }
  else {
    __first1._M_current = in_RDI;
    std::
    map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
    ::begin((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    while( true ) {
      std::
      map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
      ::end((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
             *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
      bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff68,
                              (_Self *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60)
                             );
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      __last1._M_current =
           (byte *)std::
                   _Rb_tree_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
                                 *)in_stack_ffffffffffffff58);
      this_00 = (_Rb_tree_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
                 *)std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::size
                             ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
                              in_stack_ffffffffffffff58);
      p_Var3 = (_Rb_tree_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
                *)Span<const_std::byte>::size(in_stack_ffffffffffffff58);
      bVar4 = 1;
      if (p_Var3 <= this_00) {
        std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::begin
                  ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
                   CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
        std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::end
                  ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
                   CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
        in_stack_ffffffffffffff68 =
             (__normal_iterator<const_std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
              *)Span<const_std::byte>::begin(in_stack_ffffffffffffff58);
        Span<const_std::byte>::end(in_stack_ffffffffffffff58);
        std::
        search<__gnu_cxx::__normal_iterator<std::byte_const*,std::vector<std::byte,zero_after_free_allocator<std::byte>>>,std::byte_const*>
                  (__first1,__last1,in_RDI,(byte *)CONCAT17(bVar4,in_stack_ffffffffffffff78));
        std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::begin
                  ((vector<std::byte,_zero_after_free_allocator<std::byte>_> *)
                   CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
        bVar2 = __gnu_cxx::
                operator==<const_std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
                          (in_stack_ffffffffffffff68,
                           (__normal_iterator<const_std::byte_*,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
        bVar4 = bVar2 ^ 0xff;
      }
      if ((bVar4 & 1) == 0) {
        __position._M_node._7_1_ = bVar4;
        __position._M_node._0_7_ = in_stack_ffffffffffffff78;
        std::
        map<std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::vector<std::byte,zero_after_free_allocator<std::byte>>,std::less<void>,std::allocator<std::pair<std::vector<std::byte,zero_after_free_allocator<std::byte>>const,std::vector<std::byte,zero_after_free_allocator<std::byte>>>>>
        ::erase_abi_cxx11_((map<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
                           __position);
      }
      else {
        std::
        _Rb_tree_iterator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>
        ::operator++(this_00,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      }
    }
    local_49 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_49;
  }
  __stack_chk_fail();
}

Assistant:

bool MockableBatch::ErasePrefix(Span<const std::byte> prefix)
{
    if (!m_pass) {
        return false;
    }
    auto it = m_records.begin();
    while (it != m_records.end()) {
        auto& key = it->first;
        if (key.size() < prefix.size() || std::search(key.begin(), key.end(), prefix.begin(), prefix.end()) != key.begin()) {
            it++;
            continue;
        }
        it = m_records.erase(it);
    }
    return true;
}